

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O3

bool mdns::sendRequest(int fd)

{
  pointer pcVar1;
  bool bVar2;
  string *component;
  pointer pbVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uchar local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,0,queryHeader,
             &queryFooter);
  stringSplit(&local_40,(string *)&queryName_abi_cxx11_,'.');
  if (local_40.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_40.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar3 = local_40.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_59 = (uchar)pbVar3->_M_string_length;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_58,&local_59);
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                 local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,pcVar1,pcVar1 + pbVar3->_M_string_length);
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != local_40.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
             local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,&queryFooter,
             _ZZN2cc10sendSimpleERK10ConnectionNS_3msg4TypeENS_2ns9NamespaceEE4msgs_rel);
  if (s_verbose == true) {
    puts(" > Sending request....");
  }
  bVar2 = sendData(fd,&local_58);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool sendRequest(const int fd)
{
    // Construct packet
    std::vector<uint8_t> data;
    data.insert(data.end(), queryHeader.begin(), queryHeader.end());

    for (const std::string &component : stringSplit(queryName, '.')) {
        data.push_back(uint8_t(component.size()));
        data.insert(data.end(), component.begin(), component.end());
    }

    data.insert(data.end(), queryFooter.begin(), queryFooter.end());
    if (s_verbose) puts(" > Sending request....");

    return sendData(fd, data);
}